

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ising_model.cc
# Opt level: O0

void output(vector<double,_std::allocator<double>_> *Ea,vector<double,_std::allocator<double>_> *ca,
           int simulations,double E_exact,double c_exact)

{
  double dVar1;
  double dVar2;
  double dVar3;
  _Setprecision _Var4;
  reference pvVar5;
  ostream *poVar6;
  int in_EDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  vector<double,_std::allocator<double>_> *pvVar7;
  double in_XMM0_Qa;
  double dVar8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double in_XMM1_Qa;
  int j_2;
  int j_1;
  int j;
  int local_34;
  int local_30;
  int local_2c;
  
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)in_EDX);
  *pvVar5 = 0.0;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)in_EDX);
  *pvVar5 = 0.0;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)(in_EDX + 1));
  *pvVar5 = 0.0;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)(in_EDX + 1));
  *pvVar5 = 0.0;
  for (local_2c = 0; local_2c < in_EDX; local_2c = local_2c + 1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)local_2c);
    dVar8 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)in_EDX);
    *pvVar5 = dVar8 / (double)in_EDX + *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_2c);
    dVar8 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)in_EDX);
    *pvVar5 = dVar8 / (double)in_EDX + *pvVar5;
  }
  for (local_30 = 0; local_30 < in_EDX; local_30 = local_30 + 1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)local_30);
    dVar8 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)in_EDX);
    dVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)local_30);
    dVar2 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)in_EDX);
    dVar3 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)(in_EDX + 1));
    *pvVar5 = (dVar8 - dVar1) * (dVar2 - dVar3) + *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_30);
    dVar8 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)in_EDX);
    dVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_30);
    dVar2 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)in_EDX);
    dVar3 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)(in_EDX + 1));
    *pvVar5 = (dVar8 - dVar1) * (dVar2 - dVar3) + *pvVar5;
  }
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)(in_EDX + 1));
  *pvVar5 = *pvVar5 / (((double)in_EDX - 1.0) * (double)in_EDX);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)(in_EDX + 1));
  dVar8 = sqrt(*pvVar5);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)(in_EDX + 1));
  *pvVar5 = dVar8;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)(in_EDX + 1));
  *pvVar5 = *pvVar5 / (((double)in_EDX - 1.0) * (double)in_EDX);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)(in_EDX + 1));
  dVar8 = sqrt(*pvVar5);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)(in_EDX + 1));
  *pvVar5 = dVar8;
  std::operator<<((ostream *)&std::cout,"\n\t E\t\t c\n");
  for (local_34 = 0; local_34 < in_EDX; local_34 = local_34 + 1) {
    poVar6 = std::operator<<((ostream *)&std::cout,'\t');
    _Var4 = std::setprecision(8);
    poVar6 = std::operator<<(poVar6,_Var4);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)local_34);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar5);
    poVar6 = std::operator<<(poVar6,'\t');
    _Var4 = std::setprecision(8);
    poVar6 = std::operator<<(poVar6,_Var4);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_34);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar5);
    std::operator<<(poVar6,'\n');
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"\t--------------\t--------------");
  poVar6 = std::operator<<(poVar6,'\n');
  poVar6 = std::operator<<(poVar6,"mean\t");
  _Var4 = std::setprecision(8);
  poVar6 = std::operator<<(poVar6,_Var4);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)in_EDX);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar5);
  poVar6 = std::operator<<(poVar6,'\t');
  _Var4 = std::setprecision(8);
  poVar6 = std::operator<<(poVar6,_Var4);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)in_EDX);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar5);
  poVar6 = std::operator<<(poVar6,'\n');
  poVar6 = std::operator<<(poVar6,"Del\t");
  _Var4 = std::setprecision(8);
  poVar6 = std::operator<<(poVar6,_Var4);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)in_EDX);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar5 - in_XMM0_Qa);
  poVar6 = std::operator<<(poVar6,'\t');
  _Var4 = std::setprecision(8);
  poVar6 = std::operator<<(poVar6,_Var4);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)in_EDX);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar5 - in_XMM1_Qa);
  poVar6 = std::operator<<(poVar6,'\n');
  poVar6 = std::operator<<(poVar6,"sig\t");
  _Var4 = std::setprecision(8);
  poVar6 = std::operator<<(poVar6,_Var4);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)(in_EDX + 1));
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar5);
  poVar6 = std::operator<<(poVar6,'\t');
  _Var4 = std::setprecision(8);
  poVar6 = std::operator<<(poVar6,_Var4);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)(in_EDX + 1));
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar5);
  poVar6 = std::operator<<(poVar6,'\n');
  poVar6 = std::operator<<(poVar6,"Del/sig\t");
  _Var4 = std::setprecision(8);
  poVar6 = std::operator<<(poVar6,_Var4);
  pvVar7 = in_RDI;
  std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)in_EDX);
  std::abs((int)pvVar7);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)(in_EDX + 1));
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,extraout_XMM0_Qa / *pvVar5);
  poVar6 = std::operator<<(poVar6,'\t');
  _Var4 = std::setprecision(8);
  poVar6 = std::operator<<(poVar6,_Var4);
  pvVar7 = in_RSI;
  std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)in_EDX);
  std::abs((int)pvVar7);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)(in_EDX + 1));
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,extraout_XMM0_Qa_00 / *pvVar5);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void output(std::vector<double> &Ea, std::vector<double> &ca, int simulations, double E_exact,
            double c_exact) {
  Ea[simulations] = 0.0;
  ca[simulations] = 0.0;
  Ea[simulations + 1] = 0.0;
  ca[simulations + 1] = 0.0;
  for (int j{0}; j < simulations; ++j) {
    Ea[simulations] += Ea[j] / simulations;
    ca[simulations] += ca[j] / simulations;
  }
  for (int j{0}; j < simulations; ++j) {
    Ea[simulations + 1] += (Ea[j] - Ea[simulations]) * (Ea[j] - Ea[simulations]);
    ca[simulations + 1] += (ca[j] - ca[simulations]) * (ca[j] - ca[simulations]);
  }
  Ea[simulations + 1] /= (simulations - 1.0) * simulations;
  Ea[simulations + 1] = std::sqrt(Ea[simulations + 1]);
  // Student_t(0.99, simulations-1l);
  ca[simulations + 1] /= (simulations - 1.0) * simulations;
  ca[simulations + 1] = std::sqrt(ca[simulations + 1]);
  // Student_t(0.99, simulations-1l);
  std::cout << "\n\t E\t\t c\n";
  for (int j{0}; j < simulations; ++j)
    std::cout << '\t' << std::setprecision(8) << Ea[j] << '\t' << std::setprecision(8) << ca[j]
              << '\n';
  std::cout << "\t--------------\t--------------" << '\n'
            << "mean\t" << std::setprecision(8) << Ea[simulations] << '\t'
            << std::setprecision(8) << ca[simulations] << '\n'
            << "Del\t" << std::setprecision(8) << Ea[simulations] - E_exact << '\t'
            << std::setprecision(8) << ca[simulations] - c_exact << '\n'
            << "sig\t" << std::setprecision(8) << Ea[simulations + 1] << '\t'
            << std::setprecision(8) << ca[simulations + 1] << '\n'
            << "Del/sig\t" << std::setprecision(8)
            << std::abs(Ea[simulations] - E_exact) / Ea[simulations + 1] << '\t'
            << std::setprecision(8) << std::abs(ca[simulations] - c_exact) / ca[simulations + 1]
            << std::endl;
}